

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O2

void cf_cbc_decrypt(cf_cbc *ctx,uint8_t *input,uint8_t *output,size_t blocks)

{
  size_t len;
  bool bVar1;
  uint8_t buf [16];
  uint8_t local_48 [24];
  
  len = ctx->prp->blocksz;
  while (bVar1 = blocks != 0, blocks = blocks - 1, bVar1) {
    (*ctx->prp->decrypt)(ctx->prpctx,input,local_48);
    xor_bb(output,local_48,ctx->block,len);
    memcpy(ctx->block,input,len);
    input = input + len;
    output = output + len;
  }
  return;
}

Assistant:

void cf_cbc_decrypt(cf_cbc *ctx, const uint8_t *input, uint8_t *output, size_t blocks)
{
  uint8_t buf[CF_MAXBLOCK];
  size_t nblk = ctx->prp->blocksz;

  while (blocks--)
  {
    ctx->prp->decrypt(ctx->prpctx, input, buf);
    xor_bb(output, buf, ctx->block, nblk);
    memcpy(ctx->block, input, nblk);
    input += nblk;
    output += nblk;
  }
}